

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O3

void __thiscall
stackjit::ClassMetadata::bindVirtualFunction
          (ClassMetadata *this,FunctionDefinition *funcDef,BytePtr funcPtr)

{
  int iVar1;
  runtime_error *this_00;
  
  if (this->mVirtualFunctionTable != (BytePtr *)0x0) {
    iVar1 = getVirtualFunctionIndex(this,funcDef);
    this->mVirtualFunctionTable[iVar1] = funcPtr;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Virtual function table not created.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ClassMetadata::bindVirtualFunction(const FunctionDefinition& funcDef, BytePtr funcPtr) {
		if (mVirtualFunctionTable == nullptr) {
			throw std::runtime_error("Virtual function table not created.");
		}

		auto index = getVirtualFunctionIndex(funcDef);
		mVirtualFunctionTable[index] = funcPtr;
	}